

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O2

_Bool get_quoted_string(HttpProxyNegotiator *s)

{
  strbuf *psVar1;
  ulong uVar2;
  char *pcVar3;
  uchar val;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  psVar1 = s->header;
  uVar5 = s->header_pos;
  uVar2 = psVar1->len;
  uVar4 = uVar2;
  if (uVar2 < uVar5) {
    uVar4 = uVar5;
  }
  while (((uVar6 = uVar4, uVar5 < uVar2 && (uVar6 = uVar5, (ulong)(byte)psVar1->s[uVar5] < 0x21)) &&
         ((0x100000600U >> ((ulong)(byte)psVar1->s[uVar5] & 0x3f) & 1) != 0))) {
    uVar5 = uVar5 + 1;
  }
  if ((uVar6 != uVar2) && (psVar1->s[uVar6] == '\"')) {
    strbuf_clear(s->token);
    while( true ) {
      uVar5 = uVar6 + 1;
      uVar2 = s->header->len;
      if (uVar2 <= uVar5) break;
      pcVar3 = s->header->s;
      val = pcVar3[uVar5];
      if (val == '\\') {
        uVar5 = uVar6 + 2;
        if (uVar5 == uVar2) {
          return false;
        }
        val = pcVar3[uVar5];
      }
      else if (val == '\"') break;
      BinarySink_put_byte(s->token->binarysink_,val);
      uVar6 = uVar5;
    }
    if (uVar5 != uVar2) {
      s->header_pos = uVar6 + 2;
      return true;
    }
  }
  return false;
}

Assistant:

static bool get_quoted_string(HttpProxyNegotiator *s)
{
    size_t pos = s->header_pos;

    while (pos < s->header->len && is_whitespace(s->header->s[pos]))
        pos++;

    if (pos == s->header->len)
        return false;                  /* end of string */

    if (s->header->s[pos] != '"')
        return false;
    pos++;

    strbuf_clear(s->token);
    while (pos < s->header->len && s->header->s[pos] != '"') {
        if (s->header->s[pos] == '\\') {
            /* Backslash makes the next char literal, even if it's " or \ */
            pos++;
            if (pos == s->header->len)
                return false;          /* unexpected end of string */
        }
        put_byte(s->token, s->header->s[pos++]);
    }

    if (pos == s->header->len)
        return false;                  /* no closing quote */
    pos++;

    s->header_pos = pos;
    return true;
}